

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

void RVO::linearProgram3(vector<RVO::Line,_std::allocator<RVO::Line>_> *lines,size_t numObstLines,
                        size_t beginLine,float radius,Vector2 *result)

{
  undefined8 uVar1;
  pointer pLVar2;
  Vector2 VVar3;
  size_t sVar4;
  pointer pLVar5;
  ulong uVar6;
  __normal_iterator<const_RVO::Line_*,_std::vector<RVO::Line,_std::allocator<RVO::Line>_>_> __first;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  vector<RVO::Line,_std::allocator<RVO::Line>_> projLines;
  Line local_78;
  float local_64;
  float local_60;
  float local_5c;
  vector<RVO::Line,_std::allocator<RVO::Line>_> local_58;
  ulong local_40;
  long local_38;
  
  __first._M_current =
       (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pLVar5 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (beginLine < (ulong)((long)pLVar5 - (long)__first._M_current >> 4)) {
    local_38 = numObstLines << 4;
    fVar10 = 0.0;
    local_64 = radius;
    local_40 = numObstLines;
    do {
      lVar7 = local_38;
      if (fVar10 < (__first._M_current[beginLine].point.y_ - result->y_) *
                   __first._M_current[beginLine].direction.x_ -
                   (__first._M_current[beginLine].point.x_ - result->x_) *
                   __first._M_current[beginLine].direction.y_) {
        std::vector<RVO::Line,std::allocator<RVO::Line>>::
        vector<__gnu_cxx::__normal_iterator<RVO::Line_const*,std::vector<RVO::Line,std::allocator<RVO::Line>>>,void>
                  ((vector<RVO::Line,std::allocator<RVO::Line>> *)&local_58,__first,
                   (Line *)((long)&((__first._M_current)->point).x_ + local_38),
                   (allocator_type *)&local_78);
        for (uVar6 = local_40; uVar6 < beginLine; uVar6 = uVar6 + 1) {
          local_78.direction.x_ = 0.0;
          local_78.direction.y_ = 0.0;
          pLVar2 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pLVar5 = pLVar2 + beginLine;
          fVar10 = *(float *)((long)&(pLVar2->direction).x_ + lVar7);
          fVar9 = *(float *)((long)&(pLVar2->direction).y_ + lVar7);
          fVar11 = pLVar2[beginLine].direction.x_;
          fVar8 = pLVar2[beginLine].direction.y_;
          fVar12 = fVar11 * fVar9 - fVar10 * fVar8;
          if (ABS(fVar12) <= 1e-05) {
            if (fVar11 * fVar10 + fVar9 * fVar8 <= 0.0) {
              uVar1 = *(undefined8 *)((long)&(pLVar2->point).x_ + lVar7);
              local_78.point.x_ = ((float)uVar1 + (pLVar5->point).x_) * 0.5;
              local_78.point.y_ = ((float)((ulong)uVar1 >> 0x20) + (pLVar5->point).y_) * 0.5;
              goto LAB_00108531;
            }
          }
          else {
            fVar13 = (pLVar5->point).x_;
            fVar14 = (pLVar5->point).y_;
            fVar12 = (fVar10 * (fVar14 - *(float *)((long)&(pLVar2->point).y_ + lVar7)) -
                     (fVar13 - *(float *)((long)&(pLVar2->point).x_ + lVar7)) * fVar9) / fVar12;
            local_78.point.x_ = fVar11 * fVar12 + fVar13;
            local_78.point.y_ = fVar8 * fVar12 + fVar14;
LAB_00108531:
            uVar1 = *(undefined8 *)((long)&(pLVar2->direction).x_ + lVar7);
            fVar10 = (float)uVar1 - (pLVar5->direction).x_;
            fVar9 = (float)((ulong)uVar1 >> 0x20) - (pLVar5->direction).y_;
            fVar11 = 1.0 / SQRT(fVar10 * fVar10 + fVar9 * fVar9);
            local_78.direction.y_ = fVar11 * fVar9;
            local_78.direction.x_ = fVar11 * fVar10;
            if (local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<RVO::Line,std::allocator<RVO::Line>>::_M_realloc_insert<RVO::Line_const&>
                        ((vector<RVO::Line,std::allocator<RVO::Line>> *)&local_58,
                         (iterator)
                         local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
               super__Vector_impl_data._M_finish)->point = local_78.point;
              (local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
               super__Vector_impl_data._M_finish)->direction = local_78.direction;
              local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          lVar7 = lVar7 + 0x10;
        }
        VVar3 = *result;
        pLVar5 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_78.point =
             (Vector2)(CONCAT44(pLVar5[beginLine].direction.x_,pLVar5[beginLine].direction.y_) ^
                      0x80000000);
        sVar4 = linearProgram2(&local_58,local_64,&local_78.point,true,result);
        if (sVar4 < (ulong)((long)local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          *result = VVar3;
          fVar10 = VVar3.x_;
          fVar9 = VVar3.y_;
        }
        else {
          fVar10 = result->x_;
          fVar9 = result->y_;
        }
        __first._M_current =
             (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
             super__Vector_impl_data._M_start;
        fVar11 = (__first._M_current[beginLine].point.x_ - fVar10) *
                 __first._M_current[beginLine].direction.y_;
        fVar10 = (__first._M_current[beginLine].point.y_ - fVar9) *
                 __first._M_current[beginLine].direction.x_;
        if (local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          local_60 = fVar11;
          local_5c = fVar10;
          operator_delete(local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          __first._M_current =
               (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
               super__Vector_impl_data._M_start;
          fVar10 = local_5c;
          fVar11 = local_60;
        }
        fVar10 = fVar10 - fVar11;
        pLVar5 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      beginLine = beginLine + 1;
    } while (beginLine < (ulong)((long)pLVar5 - (long)__first._M_current >> 4));
  }
  return;
}

Assistant:

void linearProgram3(const std::vector<Line> &lines, size_t numObstLines, size_t beginLine, float radius, Vector2 &result)
	{
		float distance = 0.0f;

		for (size_t i = beginLine; i < lines.size(); ++i) {
			if (det(lines[i].direction, lines[i].point - result) > distance) {
				/* Result does not satisfy constraint of line i. */
				std::vector<Line> projLines(lines.begin(), lines.begin() + static_cast<ptrdiff_t>(numObstLines));

				for (size_t j = numObstLines; j < i; ++j) {
					Line line;

					float determinant = det(lines[i].direction, lines[j].direction);

					if (std::fabs(determinant) <= RVO_EPSILON) {
						/* Line i and line j are parallel. */
						if (lines[i].direction * lines[j].direction > 0.0f) {
							/* Line i and line j point in the same direction. */
							continue;
						}
						else {
							/* Line i and line j point in opposite direction. */
							line.point = 0.5f * (lines[i].point + lines[j].point);
						}
					}
					else {
						line.point = lines[i].point + (det(lines[j].direction, lines[i].point - lines[j].point) / determinant) * lines[i].direction;
					}

					line.direction = normalize(lines[j].direction - lines[i].direction);
					projLines.push_back(line);
				}

				const Vector2 tempResult = result;

				if (linearProgram2(projLines, radius, Vector2(-lines[i].direction.y(), lines[i].direction.x()), true, result) < projLines.size()) {
					/* This should in principle not happen.  The result is by definition
					 * already in the feasible region of this linear program. If it fails,
					 * it is due to small floating point error, and the current result is
					 * kept.
					 */
					result = tempResult;
				}

				distance = det(lines[i].direction, lines[i].point - result);
			}
		}
	}